

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * __thiscall Lowerer::LowerBrFncApply(Lowerer *this,Instr *instr,JnHelperMethod helperMethod)

{
  LowererMD *this_00;
  Instr *pIVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Opnd *opndArg;
  HelperCallOpnd *src1Opnd;
  StackSym *sym;
  RegOpnd *dstOpnd;
  Instr *instr_00;
  
  pIVar1 = instr->m_prev;
  if (instr->m_src1 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2a38,"(instr->GetSrc1() != nullptr)","Expected 1 src opnd on BrFncApply");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  LoadScriptContext(this,instr);
  opndArg = IR::Instr::UnlinkSrc1(instr);
  this_00 = &this->m_lowererMD;
  LowererMD::LoadHelperArgument(this_00,instr,opndArg);
  src1Opnd = IR::HelperCallOpnd::New(helperMethod,this->m_func);
  sym = StackSym::New(TyInt64,this->m_func);
  dstOpnd = IR::RegOpnd::New(sym,TyInt64,this->m_func);
  instr_00 = IR::Instr::New(Call,&dstOpnd->super_Opnd,&src1Opnd->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(instr,instr_00);
  LowererMD::LowerCall(this_00,instr_00,0);
  IR::Instr::SetSrc1(instr,&dstOpnd->super_Opnd);
  instr->m_opcode = BrTrue_A;
  LowererMD::LowerCondBranch(this_00,instr);
  return pIVar1;
}

Assistant:

IR::Instr *
Lowerer::LowerBrFncApply(IR::Instr * instr, IR::JnHelperMethod helperMethod) {
    IR::Instr * instrPrev = instr->m_prev;
    IR::Instr * instrCall;
    IR::HelperCallOpnd  * opndHelper;
    IR::Opnd  * opndSrc;
    IR::Opnd  * opndDst;
    StackSym * symDst;

    AssertMsg(instr->GetSrc1() != nullptr, "Expected 1 src opnd on BrFncApply");

    LoadScriptContext(instr);

    opndSrc = instr->UnlinkSrc1();
    m_lowererMD.LoadHelperArgument(instr, opndSrc);

    // Generate helper call to compare the source operands.

    opndHelper = IR::HelperCallOpnd::New(helperMethod, this->m_func);
    symDst = StackSym::New(TyMachReg, this->m_func);
    opndDst = IR::RegOpnd::New(symDst, TyMachReg, this->m_func);
    instrCall = IR::Instr::New(Js::OpCode::Call, opndDst, opndHelper, this->m_func);

    instr->InsertBefore(instrCall);
    instrCall = m_lowererMD.LowerCall(instrCall, 0);

    // Branch if the result is "true".

    instr->SetSrc1(opndDst);
    instr->m_opcode = Js::OpCode::BrTrue_A;
    m_lowererMD.LowerCondBranch(instr);

    return instrPrev;
}